

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O0

int64_t SUNHashMap_GetValue(SUNHashMap map,char *key,void **value)

{
  _func_int64_t_int64_t_SUNHashMapKeyValue_void_ptr *yieldfn;
  SUNHashMapKeyValue *ppSVar1;
  undefined8 *in_RDX;
  SUNHashMap in_RSI;
  long in_RDI;
  SUNHashMapKeyValue *kvp_ptr;
  SUNHashMapKeyValue kvp;
  int collision;
  int64_t retval;
  int64_t idx;
  int local_4c;
  char *in_stack_ffffffffffffffb8;
  SUNHashMap in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffd0;
  int64_t local_8;
  
  if (((in_RDI == 0) || (in_RSI == (SUNHashMap)0x0)) || (in_RDX == (undefined8 *)0x0)) {
    local_8 = -99;
  }
  else {
    yieldfn = (_func_int64_t_int64_t_SUNHashMapKeyValue_void_ptr *)
              sunHashMapIdxFromKey(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    ppSVar1 = SUNStlVector_SUNHashMapKeyValue_At
                        (*(SUNStlVector_SUNHashMapKeyValue *)(in_RDI + 8),(int64_t)yieldfn);
    if (*ppSVar1 == (SUNHashMapKeyValue)0x0) {
      local_4c = 1;
    }
    else {
      local_4c = strcmp((*ppSVar1)->key,(char *)in_RSI);
    }
    if ((local_4c == 0) ||
       (yieldfn = (_func_int64_t_int64_t_SUNHashMapKeyValue_void_ptr *)
                  SUNHashMap_Iterate(in_RSI,(int64_t)in_RDX,yieldfn,in_stack_ffffffffffffffd0),
       yieldfn != (_func_int64_t_int64_t_SUNHashMapKeyValue_void_ptr *)0xffffffffffffff9d)) {
      ppSVar1 = SUNStlVector_SUNHashMapKeyValue_At
                          (*(SUNStlVector_SUNHashMapKeyValue *)(in_RDI + 8),(int64_t)yieldfn);
      if (ppSVar1 == (SUNHashMapKeyValue *)0x0) {
        local_8 = -1;
      }
      else {
        *in_RDX = (*ppSVar1)->value;
        local_8 = 0;
      }
    }
    else {
      local_8 = -99;
    }
  }
  return local_8;
}

Assistant:

int64_t SUNHashMap_GetValue(SUNHashMap map, const char* key, void** value)
{
  int64_t idx;
  int64_t retval;
  sunbooleantype collision;

  if (map == NULL || key == NULL || value == NULL) { return SUNHASHMAP_ERROR; }

  idx = sunHashMapIdxFromKey(map, key);

  SUNHashMapKeyValue kvp = *SUNStlVector_SUNHashMapKeyValue_At(map->buckets, idx);

  /* Check for a collision (NULL kvp means there was a collision at one point, but
     the colliding key has since been removed)*/
  collision = kvp ? strcmp(kvp->key, key) : SUNTRUE;

  /* Resolve a collision via linear probing */
  if (collision)
  {
    retval = SUNHashMap_Iterate(map, idx + 1, sunHashMapLinearProbeGet, key);
    if (retval == SUNHASHMAP_ERROR)
    {
      /* the key was either not found anywhere or an error occurred */
      return retval;
    }
    else { idx = retval; }
  }

  /* Return a reference to the value only */
  SUNHashMapKeyValue* kvp_ptr = SUNStlVector_SUNHashMapKeyValue_At(map->buckets,
                                                                   idx);
  if (kvp_ptr) { *value = (*kvp_ptr)->value; }
  else { return SUNHASHMAP_KEYNOTFOUND; }

  return (0);
}